

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__seek_to_pcm_frame__seek_table(ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex)

{
  uint uVar1;
  ma_bool32 mVar2;
  ma_result mVar3;
  long lVar4;
  ma_dr_flac *pFlac_00;
  ma_uint64 mVar5;
  ulong in_RSI;
  ma_dr_flac *in_RDI;
  ma_result result_1;
  ma_result result;
  ma_uint64 pcmFramesToDecode;
  ma_uint64 lastPCMFrameInFLACFrame;
  ma_uint64 firstPCMFrameInFLACFrame;
  ma_uint64 pcmFrameCountInThisFLACFrame;
  ma_uint32 iNextSeekpoint;
  ma_uint64 byteRangeHi;
  ma_uint64 byteRangeLo;
  ma_uint32 iSeekpoint;
  ma_uint64 runningPCMFrameCount;
  ma_bool32 isMidFrame;
  ma_uint32 iClosestSeekpoint;
  ma_dr_flac_frame_header *in_stack_000000b0;
  ma_uint8 in_stack_000000bf;
  ma_dr_flac_bs *in_stack_000000c0;
  ma_result in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ma_uint64 in_stack_ffffffffffffff90;
  ma_dr_flac_bs *in_stack_ffffffffffffff98;
  ma_uint64 mVar6;
  ma_dr_flac *pmVar7;
  uint local_34;
  ma_uint64 in_stack_ffffffffffffffd0;
  int iVar8;
  uint uVar9;
  
  iVar8 = 0;
  if (((in_RDI->pSeekpoints != (ma_dr_flac_seekpoint *)0x0) && (in_RDI->seekpointCount != 0)) &&
     (in_RDI->pSeekpoints->firstPCMFrame <= in_RSI)) {
    local_34 = 0;
    uVar1 = local_34;
    uVar9 = 0;
    while ((local_34 = uVar1, local_34 < in_RDI->seekpointCount &&
           (in_RDI->pSeekpoints[local_34].firstPCMFrame < in_RSI))) {
      uVar1 = local_34 + 1;
      uVar9 = local_34;
    }
    if (((in_RDI->pSeekpoints[uVar9].pcmFrameCount != 0) &&
        (in_RDI->pSeekpoints[uVar9].pcmFrameCount <= in_RDI->maxBlockSizeInPCMFrames)) &&
       ((in_RDI->pSeekpoints[uVar9].firstPCMFrame <= in_RDI->totalPCMFrameCount ||
        (in_RDI->totalPCMFrameCount == 0)))) {
      if (in_RDI->totalPCMFrameCount != 0) {
        if ((uVar9 < in_RDI->seekpointCount - 1) &&
           ((in_RDI->pSeekpoints[uVar9 + 1].flacFrameOffset <=
             in_RDI->pSeekpoints[uVar9].flacFrameOffset ||
            (in_RDI->pSeekpoints[uVar9 + 1].pcmFrameCount == 0)))) {
          return 0;
        }
        mVar2 = ma_dr_flac__seek_to_byte(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        if ((mVar2 != 0) &&
           (mVar2 = ma_dr_flac__read_next_flac_frame_header
                              (in_stack_000000c0,in_stack_000000bf,in_stack_000000b0), mVar2 != 0))
        {
          ma_dr_flac__get_pcm_frame_range_of_current_flac_frame
                    (in_RDI,&in_RDI->currentPCMFrame,(ma_uint64 *)0x0);
          mVar2 = ma_dr_flac__seek_to_pcm_frame__binary_search_internal
                            (in_RDI,in_RSI,CONCAT44(uVar9,iVar8),in_stack_ffffffffffffffd0);
          if (mVar2 != 0) {
            return 1;
          }
        }
      }
      if ((in_RSI < in_RDI->currentPCMFrame) ||
         (in_RDI->currentPCMFrame < in_RDI->pSeekpoints[uVar9].firstPCMFrame)) {
        mVar5 = in_RDI->pSeekpoints[uVar9].firstPCMFrame;
        mVar2 = ma_dr_flac__seek_to_byte(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        if (mVar2 == 0) {
          return 0;
        }
        mVar2 = ma_dr_flac__read_next_flac_frame_header
                          (in_stack_000000c0,in_stack_000000bf,in_stack_000000b0);
        if (mVar2 == 0) {
          return 0;
        }
      }
      else {
        mVar5 = in_RDI->currentPCMFrame;
        if ((in_RDI->currentPCMFrame == 0) && ((in_RDI->currentFLACFrame).pcmFramesRemaining == 0))
        {
          mVar2 = ma_dr_flac__read_next_flac_frame_header
                            (in_stack_000000c0,in_stack_000000bf,in_stack_000000b0);
          if (mVar2 == 0) {
            return 0;
          }
        }
        else {
          iVar8 = 1;
        }
      }
      do {
        pmVar7 = (ma_dr_flac *)0x0;
        mVar6 = 0;
        ma_dr_flac__get_pcm_frame_range_of_current_flac_frame
                  (in_RDI,(ma_uint64 *)&stack0xffffffffffffffa0,
                   (ma_uint64 *)&stack0xffffffffffffff98);
        lVar4 = (mVar6 - (long)pmVar7) + 1;
        if (in_RSI < mVar5 + lVar4) {
          pFlac_00 = (ma_dr_flac *)(in_RSI - mVar5);
          if (iVar8 != 0) {
            pmVar7 = (ma_dr_flac *)
                     ma_dr_flac__seek_forward_by_pcm_frames
                               (pFlac_00,CONCAT44(in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88));
            return (uint)(pmVar7 == pFlac_00);
          }
          mVar3 = ma_dr_flac__decode_flac_frame(pmVar7);
          if (mVar3 == MA_SUCCESS) {
            pmVar7 = (ma_dr_flac *)
                     ma_dr_flac__seek_forward_by_pcm_frames
                               (pFlac_00,(ulong)(uint)in_stack_ffffffffffffff88);
            return (uint)(pmVar7 == pFlac_00);
          }
          if (mVar3 != MA_CRC_MISMATCH) {
            return 0;
          }
          in_stack_ffffffffffffff8c = 0xffffff9c;
        }
        else {
          if (iVar8 == 0) {
            in_stack_ffffffffffffff88 = ma_dr_flac__seek_flac_frame(pmVar7);
            if (in_stack_ffffffffffffff88 != MA_SUCCESS) {
              if (in_stack_ffffffffffffff88 != MA_CRC_MISMATCH) {
                return 0;
              }
              goto LAB_00254eff;
            }
            mVar5 = lVar4 + mVar5;
          }
          else {
            mVar5 = (in_RDI->currentFLACFrame).pcmFramesRemaining + mVar5;
            (in_RDI->currentFLACFrame).pcmFramesRemaining = 0;
            iVar8 = 0;
          }
          if ((in_RSI == in_RDI->totalPCMFrameCount) && (mVar5 == in_RDI->totalPCMFrameCount)) {
            return 1;
          }
        }
LAB_00254eff:
        mVar2 = ma_dr_flac__read_next_flac_frame_header
                          (in_stack_000000c0,in_stack_000000bf,in_stack_000000b0);
      } while (mVar2 != 0);
    }
  }
  return 0;
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_pcm_frame__seek_table(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex)
{
    ma_uint32 iClosestSeekpoint = 0;
    ma_bool32 isMidFrame = MA_FALSE;
    ma_uint64 runningPCMFrameCount;
    ma_uint32 iSeekpoint;
    MA_DR_FLAC_ASSERT(pFlac != NULL);
    if (pFlac->pSeekpoints == NULL || pFlac->seekpointCount == 0) {
        return MA_FALSE;
    }
    if (pFlac->pSeekpoints[0].firstPCMFrame > pcmFrameIndex) {
        return MA_FALSE;
    }
    for (iSeekpoint = 0; iSeekpoint < pFlac->seekpointCount; ++iSeekpoint) {
        if (pFlac->pSeekpoints[iSeekpoint].firstPCMFrame >= pcmFrameIndex) {
            break;
        }
        iClosestSeekpoint = iSeekpoint;
    }
    if (pFlac->pSeekpoints[iClosestSeekpoint].pcmFrameCount == 0 || pFlac->pSeekpoints[iClosestSeekpoint].pcmFrameCount > pFlac->maxBlockSizeInPCMFrames) {
        return MA_FALSE;
    }
    if (pFlac->pSeekpoints[iClosestSeekpoint].firstPCMFrame > pFlac->totalPCMFrameCount && pFlac->totalPCMFrameCount > 0) {
        return MA_FALSE;
    }
#if !defined(MA_DR_FLAC_NO_CRC)
    if (pFlac->totalPCMFrameCount > 0) {
        ma_uint64 byteRangeLo;
        ma_uint64 byteRangeHi;
        byteRangeHi = pFlac->firstFLACFramePosInBytes + (ma_uint64)((ma_int64)(pFlac->totalPCMFrameCount * pFlac->channels * pFlac->bitsPerSample)/8.0f);
        byteRangeLo = pFlac->firstFLACFramePosInBytes + pFlac->pSeekpoints[iClosestSeekpoint].flacFrameOffset;
        if (iClosestSeekpoint < pFlac->seekpointCount-1) {
            ma_uint32 iNextSeekpoint = iClosestSeekpoint + 1;
            if (pFlac->pSeekpoints[iClosestSeekpoint].flacFrameOffset >= pFlac->pSeekpoints[iNextSeekpoint].flacFrameOffset || pFlac->pSeekpoints[iNextSeekpoint].pcmFrameCount == 0) {
                return MA_FALSE;
            }
            if (pFlac->pSeekpoints[iNextSeekpoint].firstPCMFrame != (((ma_uint64)0xFFFFFFFF << 32) | 0xFFFFFFFF)) {
                byteRangeHi = pFlac->firstFLACFramePosInBytes + pFlac->pSeekpoints[iNextSeekpoint].flacFrameOffset - 1;
            }
        }
        if (ma_dr_flac__seek_to_byte(&pFlac->bs, pFlac->firstFLACFramePosInBytes + pFlac->pSeekpoints[iClosestSeekpoint].flacFrameOffset)) {
            if (ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &pFlac->currentPCMFrame, NULL);
                if (ma_dr_flac__seek_to_pcm_frame__binary_search_internal(pFlac, pcmFrameIndex, byteRangeLo, byteRangeHi)) {
                    return MA_TRUE;
                }
            }
        }
    }
#endif
    if (pcmFrameIndex >= pFlac->currentPCMFrame && pFlac->pSeekpoints[iClosestSeekpoint].firstPCMFrame <= pFlac->currentPCMFrame) {
        runningPCMFrameCount = pFlac->currentPCMFrame;
        if (pFlac->currentPCMFrame == 0 && pFlac->currentFLACFrame.pcmFramesRemaining == 0) {
            if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                return MA_FALSE;
            }
        } else {
            isMidFrame = MA_TRUE;
        }
    } else {
        runningPCMFrameCount = pFlac->pSeekpoints[iClosestSeekpoint].firstPCMFrame;
        if (!ma_dr_flac__seek_to_byte(&pFlac->bs, pFlac->firstFLACFramePosInBytes + pFlac->pSeekpoints[iClosestSeekpoint].flacFrameOffset)) {
            return MA_FALSE;
        }
        if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
            return MA_FALSE;
        }
    }
    for (;;) {
        ma_uint64 pcmFrameCountInThisFLACFrame;
        ma_uint64 firstPCMFrameInFLACFrame = 0;
        ma_uint64 lastPCMFrameInFLACFrame = 0;
        ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &firstPCMFrameInFLACFrame, &lastPCMFrameInFLACFrame);
        pcmFrameCountInThisFLACFrame = (lastPCMFrameInFLACFrame - firstPCMFrameInFLACFrame) + 1;
        if (pcmFrameIndex < (runningPCMFrameCount + pcmFrameCountInThisFLACFrame)) {
            ma_uint64 pcmFramesToDecode = pcmFrameIndex - runningPCMFrameCount;
            if (!isMidFrame) {
                ma_result result = ma_dr_flac__decode_flac_frame(pFlac);
                if (result == MA_SUCCESS) {
                    return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, pcmFramesToDecode) == pcmFramesToDecode;
                } else {
                    if (result == MA_CRC_MISMATCH) {
                        goto next_iteration;
                    } else {
                        return MA_FALSE;
                    }
                }
            } else {
                return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, pcmFramesToDecode) == pcmFramesToDecode;
            }
        } else {
            if (!isMidFrame) {
                ma_result result = ma_dr_flac__seek_to_next_flac_frame(pFlac);
                if (result == MA_SUCCESS) {
                    runningPCMFrameCount += pcmFrameCountInThisFLACFrame;
                } else {
                    if (result == MA_CRC_MISMATCH) {
                        goto next_iteration;
                    } else {
                        return MA_FALSE;
                    }
                }
            } else {
                runningPCMFrameCount += pFlac->currentFLACFrame.pcmFramesRemaining;
                pFlac->currentFLACFrame.pcmFramesRemaining = 0;
                isMidFrame = MA_FALSE;
            }
            if (pcmFrameIndex == pFlac->totalPCMFrameCount && runningPCMFrameCount == pFlac->totalPCMFrameCount) {
                return MA_TRUE;
            }
        }
    next_iteration:
        if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
            return MA_FALSE;
        }
    }
}